

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldGenerator::
ImmutablePrimitiveOneofFieldGenerator
          (ImmutablePrimitiveOneofFieldGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  OneofDescriptor *oneof;
  
  ImmutablePrimitiveFieldGenerator::ImmutablePrimitiveFieldGenerator
            (&this->super_ImmutablePrimitiveFieldGenerator,descriptor,messageBitIndex,
             builderBitIndex,context);
  (this->super_ImmutablePrimitiveFieldGenerator).super_ImmutableFieldGenerator.
  _vptr_ImmutableFieldGenerator = (_func_int **)&PTR__ImmutablePrimitiveOneofFieldGenerator_004dacb8
  ;
  if (((byte)descriptor[1] & 0x10) == 0) {
    oneof = (OneofDescriptor *)0x0;
  }
  else {
    oneof = *(OneofDescriptor **)(descriptor + 0x28);
  }
  info = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables
            (descriptor,info,&(this->super_ImmutablePrimitiveFieldGenerator).variables_);
  return;
}

Assistant:

ImmutablePrimitiveOneofFieldGenerator::ImmutablePrimitiveOneofFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : ImmutablePrimitiveFieldGenerator(descriptor, messageBitIndex,
                                       builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}